

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O1

QStringDecoder *
QStringDecoder::decoderForHtml(QStringDecoder *__return_storage_ptr__,QByteArrayView data)

{
  optional<QStringConverter::Encoding> oVar1;
  char16_t in_CX;
  long in_FS_OFFSET;
  QByteArrayView data_00;
  QAnyStringView name;
  QByteArray local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  data_00.m_data = (storage_type *)0x0;
  data_00.m_size = (qsizetype)data.m_data;
  oVar1 = QStringConverter::encodingForData((QStringConverter *)data.m_size,data_00,in_CX);
  if (((ulong)oVar1.super__Optional_base<QStringConverter::Encoding,_true,_true>._M_payload.
              super__Optional_payload_base<QStringConverter::Encoding> >> 0x20 & 1) == 0) {
    local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    parseHtmlMetaForEncoding(&local_48,data);
    if ((undefined1 *)local_48.d.size == (undefined1 *)0x0) {
      (__return_storage_ptr__->super_QStringConverter).iface = QStringConverter::encodingInterfaces;
      (__return_storage_ptr__->super_QStringConverter).state.flags =
           (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)0x0;
      (__return_storage_ptr__->super_QStringConverter).state.internalState = 0;
      (__return_storage_ptr__->super_QStringConverter).state.remainingChars = 0;
      (__return_storage_ptr__->super_QStringConverter).state.invalidChars = 0;
      (__return_storage_ptr__->super_QStringConverter).state.field_4.d[0] = (void *)0x0;
      (__return_storage_ptr__->super_QStringConverter).state.field_4.d[1] = (void *)0x0;
      (__return_storage_ptr__->super_QStringConverter).state.clearFn = (ClearDataFn)0x0;
    }
    else {
      name.m_size = local_48.d.size;
      name.field_0.m_data = local_48.d.ptr;
      QStringConverter::QStringConverter
                (&__return_storage_ptr__->super_QStringConverter,name,(Flags)0x0);
    }
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
LAB_00341be7:
      __stack_chk_fail();
    }
  }
  else {
    (__return_storage_ptr__->super_QStringConverter).iface =
         QStringConverter::encodingInterfaces +
         ((ulong)oVar1.super__Optional_base<QStringConverter::Encoding,_true,_true>._M_payload.
                 super__Optional_payload_base<QStringConverter::Encoding> & 0xffffffff);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_28) goto LAB_00341be7;
    (__return_storage_ptr__->super_QStringConverter).state.field_4.d[1] = (void *)0x0;
    (__return_storage_ptr__->super_QStringConverter).state.clearFn = (ClearDataFn)0x0;
    (__return_storage_ptr__->super_QStringConverter).state.invalidChars = 0;
    (__return_storage_ptr__->super_QStringConverter).state.field_4.d[0] = (void *)0x0;
    (__return_storage_ptr__->super_QStringConverter).state.flags =
         (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)0x0;
    (__return_storage_ptr__->super_QStringConverter).state.internalState = 0;
    (__return_storage_ptr__->super_QStringConverter).state.remainingChars = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QStringDecoder QStringDecoder::decoderForHtml(QByteArrayView data)
{
    // determine charset
    std::optional<QStringConverter::Encoding> encoding = encodingForData(data);
    if (encoding)
        // trust the initial BOM
        return QStringDecoder(encoding.value());

    QByteArray encodingTag = parseHtmlMetaForEncoding(data);
    if (!encodingTag.isEmpty())
        return QStringDecoder(encodingTag);

    return QStringDecoder(Utf8);
}